

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_handle.cpp
# Opt level: O0

SysCallInt64Result cppnet::OsHandle::Accept(int64_t sockfd,Address *address)

{
  unsigned_long uVar1;
  uint16_t port;
  int iVar2;
  int *piVar3;
  SysCallInt64Result SVar4;
  allocator local_169;
  string local_168 [32];
  char acStack_148 [8];
  char str_addr_1 [46];
  allocator local_f9;
  string local_f8 [32];
  char acStack_d8 [8];
  char str_addr [16];
  void *addr;
  sockaddr *addr_pt;
  int64_t ret;
  undefined1 local_a8 [4];
  socklen_t addr_size;
  sockaddr_storage client_addr;
  Address *address_local;
  int64_t sockfd_local;
  int local_10;
  
  ret._4_4_ = 0x80;
  client_addr.__ss_align = (unsigned_long)address;
  iVar2 = accept((int)sockfd,(sockaddr *)local_a8,(socklen_t *)((long)&ret + 4));
  uVar1 = client_addr.__ss_align;
  sockfd_local = (int64_t)iVar2;
  if (sockfd_local < 0) {
    piVar3 = __errno_location();
    local_10 = *piVar3;
  }
  else {
    str_addr[8] = '\0';
    str_addr[9] = '\0';
    str_addr[10] = '\0';
    str_addr[0xb] = '\0';
    str_addr[0xc] = '\0';
    str_addr[0xd] = '\0';
    str_addr[0xe] = '\0';
    str_addr[0xf] = '\0';
    if (local_a8._0_2_ == 2) {
      str_addr._8_8_ = &addr_size;
      port = ntohs(local_a8._2_2_);
      Address::SetAddrPort((Address *)uVar1,port);
      Address::SetType((Address *)client_addr.__ss_align,AT_IPV4);
      acStack_d8[0] = '\0';
      acStack_d8[1] = '\0';
      acStack_d8[2] = '\0';
      acStack_d8[3] = '\0';
      acStack_d8[4] = '\0';
      acStack_d8[5] = '\0';
      acStack_d8[6] = '\0';
      acStack_d8[7] = '\0';
      str_addr[0] = '\0';
      str_addr[1] = '\0';
      str_addr[2] = '\0';
      str_addr[3] = '\0';
      str_addr[4] = '\0';
      str_addr[5] = '\0';
      str_addr[6] = '\0';
      str_addr[7] = '\0';
      inet_ntop(2,(void *)str_addr._8_8_,acStack_d8,0x10);
      uVar1 = client_addr.__ss_align;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,acStack_d8,&local_f9);
      Address::SetIp((Address *)uVar1,(string *)local_f8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
    else {
      if (local_a8._0_2_ != 10) {
        sockfd_local = -1;
        piVar3 = __errno_location();
        local_10 = *piVar3;
        goto LAB_0013940d;
      }
      str_addr._8_8_ = &client_addr;
      Address::SetAddrPort((Address *)client_addr.__ss_align,local_a8._2_2_);
      Address::SetType((Address *)client_addr.__ss_align,AT_IPV6);
      str_addr_1[0x18] = '\0';
      str_addr_1[0x19] = '\0';
      str_addr_1[0x1a] = '\0';
      str_addr_1[0x1b] = '\0';
      str_addr_1[0x1c] = '\0';
      str_addr_1[0x1d] = '\0';
      str_addr_1[0x1e] = '\0';
      str_addr_1[0x1f] = '\0';
      str_addr_1[0x20] = '\0';
      str_addr_1[0x21] = '\0';
      str_addr_1[0x22] = '\0';
      str_addr_1[0x23] = '\0';
      str_addr_1[0x24] = '\0';
      str_addr_1[0x25] = '\0';
      str_addr_1[8] = '\0';
      str_addr_1[9] = '\0';
      str_addr_1[10] = '\0';
      str_addr_1[0xb] = '\0';
      str_addr_1[0xc] = '\0';
      str_addr_1[0xd] = '\0';
      str_addr_1[0xe] = '\0';
      str_addr_1[0xf] = '\0';
      str_addr_1[0x10] = '\0';
      str_addr_1[0x11] = '\0';
      str_addr_1[0x12] = '\0';
      str_addr_1[0x13] = '\0';
      str_addr_1[0x14] = '\0';
      str_addr_1[0x15] = '\0';
      str_addr_1[0x16] = '\0';
      str_addr_1[0x17] = '\0';
      acStack_148[0] = '\0';
      acStack_148[1] = '\0';
      acStack_148[2] = '\0';
      acStack_148[3] = '\0';
      acStack_148[4] = '\0';
      acStack_148[5] = '\0';
      acStack_148[6] = '\0';
      acStack_148[7] = '\0';
      str_addr_1[0] = '\0';
      str_addr_1[1] = '\0';
      str_addr_1[2] = '\0';
      str_addr_1[3] = '\0';
      str_addr_1[4] = '\0';
      str_addr_1[5] = '\0';
      str_addr_1[6] = '\0';
      str_addr_1[7] = '\0';
      inet_ntop(10,(void *)str_addr._8_8_,acStack_148,0x2e);
      uVar1 = client_addr.__ss_align;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,acStack_148,&local_169);
      Address::SetIp((Address *)uVar1,(string *)local_168);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
    }
    local_10 = 0;
  }
LAB_0013940d:
  SVar4._errno = local_10;
  SVar4._return_value = sockfd_local;
  SVar4._12_4_ = 0;
  return SVar4;
}

Assistant:

SysCallInt64Result OsHandle::Accept(int64_t sockfd, Address& address) {
    struct sockaddr_storage client_addr;
    socklen_t addr_size = sizeof(client_addr);
    int64_t ret = accept(sockfd, (sockaddr*)&client_addr, &addr_size);
    if (ret < 0) {
        return {ret, errno};
    }

    struct sockaddr* addr_pt = (struct sockaddr*)&client_addr;

    void *addr = nullptr;
    switch (addr_pt->sa_family) {
        case AF_INET:
		{
            addr = &((struct sockaddr_in *)addr_pt)->sin_addr;
            address.SetAddrPort(ntohs(((struct sockaddr_in *)addr_pt)->sin_port));
            address.SetType(AT_IPV4);
            // get IP
            char str_addr[INET_ADDRSTRLEN] = {0};
            inet_ntop(AF_INET, addr, str_addr, sizeof(str_addr));
            address.SetIp(str_addr);
            break;
		}
        case AF_INET6:
		{
            addr = &((struct sockaddr_in6 *)addr_pt)->sin6_addr;
            address.SetAddrPort((((struct sockaddr_in6 *)addr_pt)->sin6_port));
            address.SetType(AT_IPV6);
            // get IP
            char str_addr[INET6_ADDRSTRLEN] = {0};
            inet_ntop(AF_INET6, addr, str_addr, sizeof(str_addr));
            address.SetIp(str_addr);
            break;
		}
        default:
            return {-1, errno};
    }
    
    return {ret, 0};
}